

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O1

char * fy_token_debug_text(fy_token *fyt)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *buf;
  size_t length;
  char *local_20;
  ulong local_18;
  
  if (fyt == (fy_token *)0x0) {
    pcVar5 = "<NULL>";
    goto LAB_0013e293;
  }
  switch(fyt->type) {
  case FYTT_STREAM_START:
    pcVar5 = "STRM+";
    break;
  case FYTT_STREAM_END:
    pcVar5 = "STRM-";
    break;
  case FYTT_VERSION_DIRECTIVE:
    pcVar5 = "VRSD";
    break;
  case FYTT_TAG_DIRECTIVE:
    pcVar5 = "TAGD";
    break;
  case FYTT_DOCUMENT_START:
    pcVar5 = "DOC+";
    break;
  case FYTT_DOCUMENT_END:
    pcVar5 = "DOC-";
    break;
  case FYTT_BLOCK_SEQUENCE_START:
    pcVar5 = "BSEQ+";
    break;
  case FYTT_BLOCK_MAPPING_START:
    pcVar5 = "BMAP+";
    break;
  case FYTT_BLOCK_END:
    pcVar5 = "BEND";
    break;
  case FYTT_FLOW_SEQUENCE_START:
    pcVar5 = "FSEQ+";
    break;
  case FYTT_FLOW_SEQUENCE_END:
    pcVar5 = "FSEQ-";
    break;
  case FYTT_FLOW_MAPPING_START:
    pcVar5 = "FMAP+";
    break;
  case FYTT_FLOW_MAPPING_END:
    pcVar5 = "FMAP-";
    break;
  case FYTT_BLOCK_ENTRY:
    pcVar5 = "BENTR";
    break;
  case FYTT_FLOW_ENTRY:
    pcVar5 = "FENTR";
    break;
  case FYTT_KEY:
    pcVar5 = "KEY";
    break;
  case FYTT_VALUE:
    pcVar5 = "VAL";
    break;
  case FYTT_ALIAS:
    pcVar5 = "ALIAS";
    break;
  case FYTT_ANCHOR:
    pcVar5 = "ANCHR";
    break;
  case FYTT_TAG:
    pcVar5 = "TAG";
    break;
  case FYTT_SCALAR:
    pcVar5 = "SCLR";
    break;
  case FYTT_INPUT_MARKER:
    pcVar5 = "IMRKR";
    break;
  default:
    bVar1 = true;
    pcVar5 = (char *)0x0;
    goto LAB_0013e28f;
  }
  bVar1 = false;
LAB_0013e28f:
  if (bVar1) {
    __assert_fail("typetxt",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                  ,0x3e2,"char *fy_token_debug_text(struct fy_token *)");
  }
LAB_0013e293:
  pcVar3 = fy_token_get_text(fyt,&local_18);
  uVar4 = 8;
  if (local_18 < 8) {
    uVar4 = local_18;
  }
  pcVar6 = "";
  if ((int)uVar4 < (int)local_18) {
    pcVar6 = "...";
  }
  iVar2 = asprintf(&local_20,"%s:%.*s%s",pcVar5,uVar4,pcVar3,pcVar6);
  if (iVar2 == -1) {
    __assert_fail("rc != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                  ,0x3ea,"char *fy_token_debug_text(struct fy_token *)");
  }
  return local_20;
}

Assistant:

char *fy_token_debug_text(struct fy_token *fyt) {
    const char *typetxt;
    const char *text;
    char *buf;
    size_t length;
    int wlen;
    int rc __FY_DEBUG_UNUSED__;

    if (!fyt) {
        typetxt = "<NULL>";
        goto out;
    }

    switch (fyt->type) {
        case FYTT_NONE:
            typetxt = NULL;
            break;
        case FYTT_STREAM_START:
            typetxt = "STRM+";
            break;
        case FYTT_STREAM_END:
            typetxt = "STRM-";
            break;
        case FYTT_VERSION_DIRECTIVE:
            typetxt = "VRSD";
            break;
        case FYTT_TAG_DIRECTIVE:
            typetxt = "TAGD";
            break;
        case FYTT_DOCUMENT_START:
            typetxt = "DOC+";
            break;
        case FYTT_DOCUMENT_END:
            typetxt = "DOC-";
            break;
        case FYTT_BLOCK_SEQUENCE_START:
            typetxt = "BSEQ+";
            break;
        case FYTT_BLOCK_MAPPING_START:
            typetxt = "BMAP+";
            break;
        case FYTT_BLOCK_END:
            typetxt = "BEND";
            break;
        case FYTT_FLOW_SEQUENCE_START:
            typetxt = "FSEQ+";
            break;
        case FYTT_FLOW_SEQUENCE_END:
            typetxt = "FSEQ-";
            break;
        case FYTT_FLOW_MAPPING_START:
            typetxt = "FMAP+";
            break;
        case FYTT_FLOW_MAPPING_END:
            typetxt = "FMAP-";
            break;
        case FYTT_BLOCK_ENTRY:
            typetxt = "BENTR";
            break;
        case FYTT_FLOW_ENTRY:
            typetxt = "FENTR";
            break;
        case FYTT_KEY:
            typetxt = "KEY";
            break;
        case FYTT_SCALAR:
            typetxt = "SCLR";
            break;
        case FYTT_VALUE:
            typetxt = "VAL";
            break;
        case FYTT_ALIAS:
            typetxt = "ALIAS";
            break;
        case FYTT_ANCHOR:
            typetxt = "ANCHR";
            break;
        case FYTT_TAG:
            typetxt = "TAG";
            break;
        case FYTT_INPUT_MARKER:
            typetxt = "IMRKR";
            break;
        default:
            typetxt = NULL;
            break;
    }
    /* should never happen really */
    assert(typetxt);

    out:
    text = fy_token_get_text(fyt, &length);

    wlen = length > 8 ? 8 : length;

    rc = asprintf(&buf, "%s:%.*s%s", typetxt, wlen, text, wlen < (int) length ? "..." : "");
    assert(rc != -1);

    return buf;
}